

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int iBreak)

{
  Vdbe *p_00;
  int p2;
  int addr_00;
  int iVar1;
  int iVar2;
  KeyInfo *zP4;
  int r1_1;
  int r2;
  int r1;
  int addr2;
  int addr1;
  int addr;
  int iContinue;
  Vdbe *v;
  int regPrev_local;
  int regReturn_local;
  SelectDest *pDest_local;
  SelectDest *pIn_local;
  Select *p_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  pParse_local._4_4_ = sqlite3VdbeCurrentAddr(p_00);
  p2 = sqlite3VdbeMakeLabel(pParse);
  if (regPrev != 0) {
    addr_00 = sqlite3VdbeAddOp1(p_00,0x14,regPrev);
    iVar1 = pIn->iSdst;
    iVar2 = pIn->nSdst;
    zP4 = sqlite3KeyInfoRef(pKeyInfo);
    iVar1 = sqlite3VdbeAddOp4(p_00,0x57,iVar1,regPrev + 1,iVar2,(char *)zP4,-9);
    sqlite3VdbeAddOp3(p_00,0x10,iVar1 + 2,p2,iVar1 + 2);
    sqlite3VdbeJumpHere(p_00,addr_00);
    sqlite3VdbeAddOp3(p_00,0x4e,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp2(p_00,0x46,1,regPrev);
  }
  if (pParse->db->mallocFailed == '\0') {
    codeOffset(p_00,p->iOffset,p2);
    switch(pDest->eDest) {
    case '\n':
      sqlite3ExprCodeMove(pParse,pIn->iSdst,pDest->iSDParm,1);
      break;
    case '\v':
      iVar1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(p_00,0x5c,pIn->iSdst,pIn->nSdst,iVar1,pDest->zAffSdst,pIn->nSdst);
      sqlite3VdbeAddOp4Int(p_00,0x84,pDest->iSDParm,iVar1,pIn->iSdst,pIn->nSdst);
      sqlite3ReleaseTempReg(pParse,iVar1);
      break;
    case '\f':
      iVar1 = sqlite3GetTempReg(pParse);
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p_00,0x5c,pIn->iSdst,pIn->nSdst,iVar1);
      sqlite3VdbeAddOp2(p_00,0x79,pDest->iSDParm,iVar2);
      sqlite3VdbeAddOp3(p_00,0x7a,pDest->iSDParm,iVar1,iVar2);
      sqlite3VdbeChangeP5(p_00,8);
      sqlite3ReleaseTempReg(pParse,iVar2);
      sqlite3ReleaseTempReg(pParse,iVar1);
      break;
    case '\r':
      if (pDest->iSdst == 0) {
        iVar1 = sqlite3GetTempRange(pParse,pIn->nSdst);
        pDest->iSdst = iVar1;
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse,pIn->iSdst,pDest->iSdst,pIn->nSdst);
      sqlite3VdbeAddOp1(p_00,0xe,pDest->iSDParm);
      break;
    default:
      sqlite3VdbeAddOp2(p_00,0x51,pIn->iSdst,pIn->nSdst);
    }
    if (p->iLimit != 0) {
      sqlite3VdbeAddOp2(p_00,0x31,p->iLimit,iBreak);
    }
    sqlite3VdbeResolveLabel(p_00,p2);
    sqlite3VdbeAddOp1(p_00,0x42,regReturn);
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(pParse);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int addr1, addr2;
    addr1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev); VdbeCoverage(v);
    addr2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)sqlite3KeyInfoRef(pKeyInfo), P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr2+2, iContinue, addr2+2); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p->iOffset, iContinue);

  assert( pDest->eDest!=SRT_Exists );
  assert( pDest->eDest!=SRT_Table );
  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)".
    */
    case SRT_Set: {
      int r1;
      testcase( pIn->nSdst>1 );
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, 
          r1, pDest->zAffSdst, pIn->nSdst);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pDest->iSDParm, r1,
                           pIn->iSdst, pIn->nSdst);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 || pParse->nErr>0 );  testcase( pIn->nSdst!=1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}